

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

int rs_restore_file(FILE *inf)

{
  pointer pAVar1;
  value_type pMVar2;
  byte bVar3;
  int iVar4;
  int *piVar5;
  MonsterThing *pMVar6;
  ItemThing *pIVar7;
  daemon_function_t p_Var8;
  ulong uVar9;
  list<ItemThing_*,_std::allocator<ItemThing_*>_> *plVar10;
  ItemThing **item;
  ItemThing **item_00;
  ItemThing **item_01;
  ItemThing **item_02;
  ItemThing **item_03;
  ItemThing **item_04;
  uint y;
  char **master;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  iterator __end1;
  long lVar14;
  uint x;
  list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *plVar15;
  bool bVar16;
  int value;
  uint uStack_3c;
  int cnt;
  int value_1;
  
  bVar3 = format_error | read_error;
  if ((bVar3 & 1) == 0) {
    rs_read_boolean(inf,&after);
    rs_read_boolean(inf,&again);
    rs_read_boolean(inf,&seenstairs);
    rs_read_boolean(inf,&amulet);
    rs_read_boolean(inf,&door_stop);
    rs_read_boolean(inf,&fight_flush);
    rs_read_boolean(inf,&firstmove);
    rs_read_boolean(inf,&has_hit);
    rs_read_boolean(inf,&inv_describe);
    rs_read_boolean(inf,&jump);
    rs_read_boolean(inf,&kamikaze);
    rs_read_boolean(inf,&lower_msg);
    rs_read_boolean(inf,&move_on);
    rs_read_boolean(inf,&passgo);
    rs_read_boolean(inf,&playing);
    rs_read_boolean(inf,&running);
    rs_read_boolean(inf,&save_msg);
    rs_read_boolean(inf,&terse);
    rs_read_boolean(inf,&to_death);
    _value = (MonsterThing *)((ulong)uStack_3c << 0x20);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_int(inf,&value);
      if (value != 0x1a) {
        format_error = 1;
      }
      lVar14 = 0;
      do {
        if (lVar14 == 0x1a) break;
        iVar4 = rs_read_boolean(inf,pack_used + lVar14);
        lVar14 = lVar14 + 1;
      } while (iVar4 == 0);
    }
    rs_read_int(inf,&dir_ch);
    rs_read_chars(inf,file_name,0x400);
    rs_read_chars(inf,huh,0x400);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      for (lVar14 = 0; lVar14 != 0x70; lVar14 = lVar14 + 8) {
        rs_read_string_index(inf,rainbow,cNCOLORS,(char **)((long)p_colors + lVar14));
      }
    }
    rs_read_chars(inf,prbuf,0x800);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      for (lVar14 = 0; iVar4 = cNSTONES, lVar14 != 0xe; lVar14 = lVar14 + 1) {
        _value = (MonsterThing *)((ulong)_value & 0xffffffff00000000);
        if ((read_error == 0) && ((format_error & 1) == 0)) {
          rs_read_int(inf,&value);
          if (iVar4 < value) {
            format_error = 1;
          }
          else if (value < 0) {
            r_stones[lVar14] = (char *)0x0;
          }
          else {
            r_stones[lVar14] = stones[(ulong)_value & 0xffffffff].st_name;
          }
        }
      }
    }
    rs_read_int(inf,&runch);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      for (lVar14 = 0; lVar14 != 0x98; lVar14 = lVar14 + 8) {
        rs_read_new_string(inf,(char **)((long)s_names + lVar14));
      }
    }
    rs_read_char(inf,&take);
    _value = (MonsterThing *)((ulong)_value & 0xffffffff00000000);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      for (lVar14 = 0; lVar14 != 0x70; lVar14 = lVar14 + 8) {
        rs_read_int(inf,&value);
        bVar16 = value == 0;
        master = metal;
        if (bVar16) {
          master = wood;
        }
        pcVar12 = "wand";
        if (bVar16) {
          pcVar12 = "staff";
        }
        piVar5 = &cNMETAL;
        if (bVar16) {
          piVar5 = &cNWOOD;
        }
        rs_read_string_index(inf,master,*piVar5,(char **)((long)ws_made + lVar14));
        *(char **)((long)ws_type + lVar14) = pcVar12;
      }
    }
    rs_read_int(inf,&l_last_comm);
    rs_read_int(inf,&l_last_dir);
    rs_read_int(inf,&last_comm);
    rs_read_int(inf,&last_dir);
    rs_read_int(inf,&n_objs);
    rs_read_int(inf,&hungry_state);
    rs_read_int(inf,&inv_type);
    rs_read_int(inf,&level);
    rs_read_int(inf,&max_level);
    rs_read_int(inf,&no_food);
    rs_read_ints(inf,a_class,8);
    rs_read_int(inf,&count);
    rs_read_int(inf,&food_left);
    rs_read_int(inf,&lastscore);
    rs_read_int(inf,&no_command);
    rs_read_int(inf,&no_move);
    rs_read_int(inf,&purse);
    rs_read_int(inf,&quiet);
    rs_read_int(inf,&vf_hit);
    rs_read_int(inf,&dnum);
    rs_read_ints(inf,e_levels,0x15);
    rs_read_coord(inf,&delta);
    rs_read_coord(inf,&oldpos);
    rs_read_coord(inf,&stairs);
    rs_read_thing(inf,&player);
    rs_read_object_reference(inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&cur_armor,item)
    ;
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)cur_ring,item_00);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)(cur_ring + 1),item_01);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&cur_weapon,item_02);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&l_last_pick,item_03);
    rs_read_object_reference
              (inf,(list<ItemThing_*,_std::allocator<ItemThing_*>_> *)&last_pick,item_04);
    rs_read_object_list(inf,&lvl_obj_abi_cxx11_);
    _value = (MonsterThing *)0x0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff7);
      rs_read_int(inf,&cnt);
      iVar4 = 0;
      if (0 < cnt) {
        iVar4 = cnt;
      }
      while (bVar16 = iVar4 != 0, iVar4 = iVar4 + -1, bVar16) {
        pMVar6 = (MonsterThing *)operator_new(0x68);
        MonsterThing::MonsterThing(pMVar6);
        _value = pMVar6;
        std::__cxx11::list<MonsterThing_*,_std::allocator<MonsterThing_*>_>::push_back
                  (&mlist_abi_cxx11_,(value_type *)&value);
        rs_read_thing(inf,_value);
      }
    }
    rs_fix_monster(&player);
    plVar15 = &mlist_abi_cxx11_;
    while (plVar15 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                     (plVar15->super__List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_>).
                     _M_impl._M_node.super__List_node_base._M_next, plVar15 != &mlist_abi_cxx11_) {
      rs_fix_monster(*(MonsterThing **)((long)plVar15 + 0x10));
    }
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      for (lVar14 = 0; lVar14 != 0xa00; lVar14 = lVar14 + 1) {
        rs_read_char(inf,&places[lVar14].p_ch);
        rs_read_int(inf,&places[lVar14].p_flags);
        if (((format_error | read_error) & 1) == 0) {
          rs_read_int(inf,&value);
          if (value == -1) {
            pMVar6 = (MonsterThing *)0x0;
          }
          else {
            iVar4 = value + 1;
            plVar15 = &mlist_abi_cxx11_;
            do {
              plVar15 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                        (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                         &((_List_node_base *)plVar15)->_M_next)->_M_impl)._M_node.
                        super__List_node_base._M_next;
              iVar4 = iVar4 + -1;
            } while (0 < iVar4);
            pMVar6 = *(MonsterThing **)((long)plVar15 + 0x10);
          }
          places[lVar14].p_monst = pMVar6;
        }
        if (((read_error & 1) == 0) && ((format_error & 1) == 0)) {
          rs_read_int(inf,&value);
          if (value == -1) {
            pIVar7 = (ItemThing *)0x0;
          }
          else {
            iVar4 = value + 1;
            plVar10 = &lvl_obj_abi_cxx11_;
            do {
              plVar10 = (list<ItemThing_*,_std::allocator<ItemThing_*>_> *)
                        (((_List_base<ItemThing_*,_std::allocator<ItemThing_*>_> *)
                         &((_List_node_base *)plVar10)->_M_next)->_M_impl)._M_node.
                        super__List_node_base._M_next;
              iVar4 = iVar4 + -1;
            } while (0 < iVar4);
            pIVar7 = *(ItemThing **)((long)plVar10 + 0x10);
          }
          places[lVar14].p_item = pIVar7;
        }
      }
    }
    rs_read_stats(inf,&max_stats);
    _value = (MonsterThing *)((ulong)_value & 0xffffffff00000000);
    if (((format_error | read_error) & 1) == 0) {
      rs_read_int(inf,&value);
      pMVar2 = _value;
      iVar4 = value;
      if ((long)value < 0) {
        format_error = 1;
      }
      std::vector<Area,_std::allocator<Area>_>::resize(&areas,(long)value);
      lVar14 = 0;
      uVar9 = 0;
      if (0 < iVar4) {
        uVar9 = (ulong)pMVar2 & 0xffffffff;
      }
      while( true ) {
        pAVar1 = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar9 * 0x14 - lVar14 == 0) break;
        if (((read_error | format_error) & 1) == 0) {
          rs_read_coord(inf,(coord *)((long)&((areas.super__Vector_base<Area,_std::allocator<Area>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->position)
                                             .x + lVar14));
          rs_read_coord(inf,(coord *)((long)&(pAVar1->size).x + lVar14));
          rs_read_int(inf,(int *)((long)&pAVar1->flags + lVar14));
        }
        lVar14 = lVar14 + 0x14;
      }
    }
    _value = (MonsterThing *)((ulong)_value & 0xffffffff00000000);
    if (((format_error | read_error) & 1) == 0) {
      rs_read_marker(inf,-0x5432fff5);
      rs_read_int(inf,&value);
      if (value != 0x1a) {
        format_error = 1;
      }
      for (lVar14 = 0x10; lVar14 != 0x5c0; lVar14 = lVar14 + 0x38) {
        rs_read_stats(inf,(stats *)(monsters[0].m_stats.s_dmg + lVar14 + -0x24));
      }
    }
    rs_read_obj_info(inf,things,7);
    rs_read_obj_info(inf,food_info,7);
    rs_read_obj_info(inf,arm_info,8);
    rs_read_obj_info(inf,pot_info,0xe);
    rs_read_obj_info(inf,ring_info,0xe);
    rs_read_obj_info(inf,scr_info,0x13);
    rs_read_obj_info(inf,weap_info,10);
    rs_read_obj_info(inf,ws_info,0xe);
    cnt = 0;
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff2);
      rs_read_int(inf,&cnt);
      if (0x14 < cnt) {
        format_error = 1;
      }
      piVar5 = &d_list[0].d_arg;
      lVar14 = 0x14;
      while (bVar16 = lVar14 != 0, lVar14 = lVar14 + -1, bVar16) {
        _value = (MonsterThing *)((ulong)_value & 0xffffffff00000000);
        rs_read_int(inf,(int *)(piVar5 + -4));
        rs_read_int(inf,&value);
        rs_read_int(inf,piVar5);
        rs_read_int(inf,piVar5 + 1);
        if (value - 1U < 9) {
          p_Var8 = (daemon_function_t)(&PTR_rollwand_0015bbc0)[value - 1U];
        }
        else {
          p_Var8 = (daemon_function_t)0x0;
        }
        *(daemon_function_t *)(piVar5 + -2) = p_Var8;
        piVar5 = piVar5 + 6;
      }
      if (prname::tbuf._8_8_ == 0) {
        prname::tbuf[0] = '\0';
        prname::tbuf[1] = '\0';
        prname::tbuf[2] = '\0';
        prname::tbuf[3] = '\0';
        prname::tbuf[0x10] = '\0';
        prname::tbuf[0x11] = '\0';
        prname::tbuf[0x12] = '\0';
        prname::tbuf[0x13] = '\0';
        prname::tbuf[0x14] = '\0';
        prname::tbuf[0x15] = '\0';
        prname::tbuf[0x16] = '\0';
        prname::tbuf[0x17] = '\0';
      }
    }
    rs_read_int(inf,&between);
    rs_read_int(inf,&group);
    if ((read_error == 0) && ((format_error & 1) == 0)) {
      rs_read_marker(inf,-0x5432fff3);
      rs_read_int(inf,&value);
      rs_read_int(inf,&cnt);
      y = 0;
      uVar13 = cnt;
      if (cnt < 1) {
        uVar13 = 0;
      }
      uVar11 = value;
      if (value < 1) {
        uVar11 = 0;
      }
      for (; y != uVar11; y = y + 1) {
        for (x = 0; uVar13 != x; x = x + 1) {
          iVar4 = rs_read_int(inf,&value_1);
          if (iVar4 != 0) goto LAB_001241b2;
          if (x < 0x50 && y < 0x20) {
            setMapDisplay(x,y,value_1);
          }
        }
      }
    }
LAB_001241b2:
    bVar3 = read_error | format_error;
  }
  return bVar3 & 1;
}

Assistant:

int rs_restore_file(FILE *inf)
{
    if (read_error || format_error)
        return(READSTAT);

    rs_read_boolean(inf, &after);               /* 1  */    /* extern.c */
    rs_read_boolean(inf, &again);               /* 2  */
    rs_read_boolean(inf, &seenstairs);          /* 4  */
    rs_read_boolean(inf, &amulet);              /* 5  */
    rs_read_boolean(inf, &door_stop);           /* 6  */
    rs_read_boolean(inf, &fight_flush);         /* 7  */
    rs_read_boolean(inf, &firstmove);           /* 8  */
    rs_read_boolean(inf, &has_hit);             /* 10 */
    rs_read_boolean(inf, &inv_describe);        /* 12 */
    rs_read_boolean(inf, &jump);                /* 13 */
    rs_read_boolean(inf, &kamikaze);            /* 14 */
    rs_read_boolean(inf, &lower_msg);           /* 15 */
    rs_read_boolean(inf, &move_on);             /* 16 */
    rs_read_boolean(inf, &passgo);              /* 18 */
    rs_read_boolean(inf, &playing);             /* 19 */
    rs_read_boolean(inf, &running);             /* 21 */
    rs_read_boolean(inf, &save_msg);            /* 22 */
    rs_read_boolean(inf, &terse);               /* 25 */
    rs_read_boolean(inf, &to_death);            /* 26 */
    rs_read_booleans(inf, pack_used, 26);       /* 29 */
    rs_read_int(inf, &dir_ch);
    rs_read_chars(inf, file_name, MAXSTR);
    rs_read_chars(inf, huh, MAXSTR);
    rs_read_potions(inf);
    rs_read_chars(inf, prbuf, 2*MAXSTR);
    rs_read_rings(inf);
    rs_read_int(inf, &runch);
    rs_read_scrolls(inf);
    rs_read_char(inf, &take);
    rs_read_sticks(inf);
    rs_read_int(inf, &l_last_comm);
    rs_read_int(inf, &l_last_dir);
    rs_read_int(inf, &last_comm);
    rs_read_int(inf, &last_dir);
    rs_read_int(inf, &n_objs);
    rs_read_int(inf, &hungry_state);
    rs_read_int(inf, &inv_type);
    rs_read_int(inf, &level);
    rs_read_int(inf, &max_level);
    rs_read_int(inf, &no_food);
    rs_read_ints(inf,a_class,MAXARMORS);
    rs_read_int(inf, &count);
    rs_read_int(inf, &food_left);
    rs_read_int(inf, &lastscore);
    rs_read_int(inf, &no_command);
    rs_read_int(inf, &no_move);
    rs_read_int(inf, &purse);
    rs_read_int(inf, &quiet);
    rs_read_int(inf, &vf_hit);
    rs_read_int(inf, &dnum);
    rs_read_ints(inf,e_levels,21);
    rs_read_coord(inf, &delta);
    rs_read_coord(inf, &oldpos);
    rs_read_coord(inf, &stairs);

    rs_read_thing(inf, &player); 
    rs_read_object_reference(inf, player.pack, &cur_armor);
    rs_read_object_reference(inf, player.pack, &cur_ring[0]);
    rs_read_object_reference(inf, player.pack, &cur_ring[1]);
    rs_read_object_reference(inf, player.pack, &cur_weapon);
    rs_read_object_reference(inf, player.pack, &l_last_pick);
    rs_read_object_reference(inf, player.pack, &last_pick);

    rs_read_object_list(inf, lvl_obj);
    rs_read_monster_list(inf);                  
    rs_fix_monster(&player);
    rs_fix_monster_list();

    rs_read_places(inf,places,MAXLINES*MAXCOLS);

    rs_read_stats(inf, &max_stats);
    rs_read_areas(inf);

    rs_read_monsters(inf,monsters,26);                  
    rs_read_obj_info(inf, things,   NUMITEMTYPES);         
    rs_read_obj_info(inf, food_info, MAXFOODS);  
    rs_read_obj_info(inf, arm_info,  MAXARMORS);         
    rs_read_obj_info(inf, pot_info,  MAXPOTIONS);       
    rs_read_obj_info(inf, ring_info, MAXRINGS);         
    rs_read_obj_info(inf, scr_info,  MAXSCROLLS);       
    rs_read_obj_info(inf, weap_info, MAXWEAPONS+1);       
    rs_read_obj_info(inf, ws_info,   MAXSTICKS);       

    rs_read_daemons(inf, d_list, 20);                   /* 5.4-daemon.c     */
    rs_read_int(inf,&between);                          /* 5.4-daemons.c    */
    rs_read_int(inf,&group);                            /* 5.4-weapons.c    */
    
    rs_read_window(inf);

    return(READSTAT);
}